

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
grow(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this,
    Entry *oldEntries,size_t *newMemUsed)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Entry *pEVar5;
  ReductionKey *this_00;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  Entry *newEntry;
  int newIndex;
  Entry *oldEntry;
  uint32_t oldIndex;
  uint32_t mask;
  Entry *entries;
  uint32_t numNewEntries;
  Entry *pEVar6;
  value_type *in_stack_ffffffffffffff78;
  Entry *pEVar7;
  vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  *in_stack_ffffffffffffff80;
  uint local_4c;
  uint local_3c;
  
  std::
  vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  uVar2 = *(int *)(in_RDI + 8) * 2;
  uVar3 = CONCAT44(0,uVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pEVar5 = (Entry *)operator_new__(uVar4);
  if (uVar3 != 0) {
    pEVar7 = pEVar5 + uVar3;
    pEVar6 = pEVar5;
    do {
      Entry::Entry(pEVar6);
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar7);
  }
  *in_RDX = (ulong)uVar2 << 4;
  for (local_3c = 0; local_3c < *(uint *)(in_RDI + 8); local_3c = local_3c + 1) {
    this_00 = (ReductionKey *)(in_RSI + (ulong)local_3c * 0x10);
    if (this_00[1]._val != 0) {
      local_4c = PtexReader::ReductionKey::hash(this_00);
      while (pEVar6 = pEVar5 + (local_4c & uVar2 - 1), pEVar6->value != (FaceData *)0x0) {
        local_4c = local_4c + 1;
      }
      PtexReader::ReductionKey::move(&pEVar6->key,this_00);
      pEVar6->value = (FaceData *)this_00[1]._val;
    }
  }
  *(uint *)(in_RDI + 8) = uVar2;
  return pEVar5;
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }